

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInAscii * __thiscall chrono::ChStreamInAscii::operator>>(ChStreamInAscii *this,double *dVal)

{
  double dVar1;
  string buffer;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  string local_38 [32];
  
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = '\0';
  (*(this->super_ChStreamIn)._vptr_ChStreamIn[0xb])(this,&local_58);
  std::__cxx11::string::string(local_38,(string *)&local_58);
  std::__cxx11::string::~string(local_38);
  dVar1 = atof(local_58);
  *dVal = dVar1;
  std::__cxx11::string::~string((string *)&local_58);
  return this;
}

Assistant:

ChStreamInAscii& ChStreamInAscii::operator>>(double& dVal) {
    std::string buffer;
    *this >> buffer;
    RemoveTrailingCommas(buffer);
    dVal = atof(buffer.c_str());
    // if (errno)
    // throw (ChException( "String " +buffer+ " is not a valid number format"));
    return *this;
}